

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Window * windowFind(Parse *pParse,Window *pList,char *zName)

{
  int iVar1;
  Window *local_28;
  Window *p;
  char *zName_local;
  Window *pList_local;
  Parse *pParse_local;
  
  local_28 = pList;
  while ((local_28 != (Window *)0x0 && (iVar1 = sqlite3StrICmp(local_28->zName,zName), iVar1 != 0)))
  {
    local_28 = local_28->pNextWin;
  }
  if (local_28 == (Window *)0x0) {
    sqlite3ErrorMsg(pParse,"no such window: %s",zName);
  }
  return local_28;
}

Assistant:

static Window *windowFind(Parse *pParse, Window *pList, const char *zName){
  Window *p;
  for(p=pList; p; p=p->pNextWin){
    if( sqlite3StrICmp(p->zName, zName)==0 ) break;
  }
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such window: %s", zName);
  }
  return p;
}